

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.h
# Opt level: O2

uint ** ADS::Algorithms<unsigned_int>::dijskstra(Graph<unsigned_int> *pGraph,PQueue *pQueue)

{
  uint **ppuVar1;
  uint *puVar2;
  uint i;
  ulong uVar3;
  
  ppuVar1 = (uint **)allocateArray(pGraph->_uiNVertexes,8);
  for (uVar3 = 0; uVar3 < pGraph->_uiNVertexes; uVar3 = uVar3 + 1) {
    puVar2 = dijskstra(pGraph,(uint)uVar3,pQueue);
    ppuVar1[uVar3] = puVar2;
  }
  return ppuVar1;
}

Assistant:

T ** Algorithms<T>::dijskstra (Graph<T> *pGraph, PQueue *pQueue)
    {
        T **ppDistances = static_cast<T**>(allocateArray (pGraph->getVertexCount(), sizeof (T *)));
        for (unsigned int i = 0; i < pGraph->getVertexCount(); i++)
            ppDistances[i] = dijskstra (pGraph, i, pQueue);
        return ppDistances;
    }